

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O0

mz_uint tdefl_create_comp_flags_from_zip_params(int level,int window_bits,int strategy)

{
  uint uVar1;
  int local_18;
  int local_14;
  mz_uint comp_flags;
  int strategy_local;
  int window_bits_local;
  int level_local;
  
  if (level < 0) {
    local_18 = 6;
  }
  else {
    local_14 = level;
    if (10 < level) {
      local_14 = 10;
    }
    local_18 = local_14;
  }
  uVar1 = 0;
  if (level < 4) {
    uVar1 = 0x4000;
  }
  comp_flags = s_tdefl_num_probes[local_18] | uVar1;
  if (0 < window_bits) {
    comp_flags = comp_flags | 0x1000;
  }
  if (level == 0) {
    comp_flags = comp_flags | 0x80000;
  }
  else if (strategy == 1) {
    comp_flags = comp_flags | 0x20000;
  }
  else if (strategy == 2) {
    comp_flags = comp_flags & 0xfffff000;
  }
  else if (strategy == 4) {
    comp_flags = comp_flags | 0x40000;
  }
  else if (strategy == 3) {
    comp_flags = comp_flags | 0x10000;
  }
  return comp_flags;
}

Assistant:

inline mz_uint tdefl_create_comp_flags_from_zip_params(int level, int window_bits, int strategy) {

    mz_uint comp_flags = s_tdefl_num_probes[(level >= 0) ? MZ_MIN(10,
                                                                  level) : MZ_DEFAULT_LEVEL]
            | ((level <= 3) ? TDEFL_GREEDY_PARSING_FLAG : 0);
    if (window_bits > 0)
        comp_flags |= TDEFL_WRITE_ZLIB_HEADER;

    if (!level)
        comp_flags |= TDEFL_FORCE_ALL_RAW_BLOCKS;
    else if (strategy == MZ_FILTERED)
        comp_flags |= TDEFL_FILTER_MATCHES;
    else if (strategy == MZ_HUFFMAN_ONLY)
        comp_flags &= ~TDEFL_MAX_PROBES_MASK;
    else if (strategy == MZ_FIXED)
        comp_flags |= TDEFL_FORCE_ALL_STATIC_BLOCKS;
    else if (strategy == MZ_RLE)
        comp_flags |= TDEFL_RLE_MATCHES;

    return comp_flags;
}